

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall Timer::Register(Timer *this,TimeEvent *timer)

{
  double dVar1;
  TimeEvent *local_18;
  
  if (timer->lifetime != 0) {
    local_18 = timer;
    dVar1 = GetTime();
    timer->lasttime = dVar1;
    timer->manager = this;
    this->changed = true;
    std::
    _Rb_tree<TimeEvent*,TimeEvent*,std::_Identity<TimeEvent*>,std::less<TimeEvent*>,std::allocator<TimeEvent*>>
    ::_M_insert_unique<TimeEvent*const&>
              ((_Rb_tree<TimeEvent*,TimeEvent*,std::_Identity<TimeEvent*>,std::less<TimeEvent*>,std::allocator<TimeEvent*>>
                *)&this->timers,&local_18);
  }
  return;
}

Assistant:

void Timer::Register(TimeEvent *timer)
{
	if (timer->lifetime == 0)
	{
		return;
	}

	timer->lasttime = Timer::GetTime();
	timer->manager = this;

	this->changed = true;
	this->timers.insert(timer);
}